

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoSimdUnop<float,unsigned_int>(Thread *this,UnopFunc<float,_unsigned_int> *f)

{
  Simd<unsigned_int,_(unsigned_char)__x04_> val;
  SR result;
  Value local_38;
  Value local_28;
  
  local_38 = Pop(this);
  std::transform<unsigned_int*,float*,float(*)(unsigned_int)>
            (&local_38.i32_,&local_28.i32_,(float *)&local_28.f32_,f);
  Push(this,local_28);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdUnop(UnopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  auto val = Pop<ST>();
  SR result;
  std::transform(std::begin(val.v), std::end(val.v), std::begin(result.v), f);
  Push(result);
  return RunResult::Ok;
}